

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *data;
  LodePNGColorMode *info;
  LodePNGColorMode *info_00;
  LodePNGInfo *info_01;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  uchar **ppuVar8;
  uint *puVar9;
  uchar uVar10;
  uint bpp;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uchar *puVar17;
  ulong uVar18;
  uchar *puVar19;
  size_t sVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  size_t bytewidth;
  bool bVar28;
  uchar *scanlines;
  uchar **local_268;
  uint *local_260;
  size_t *local_258;
  uchar **local_250;
  size_t scanlines_size;
  size_t local_240;
  uint passh_1 [7];
  uint passw_1 [7];
  uint passh [7];
  uint passw [7];
  size_t passstart [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  scanlines = (uchar *)0x0;
  scanlines_size = 0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar11 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar11;
  if (uVar11 == 0) {
    uVar15 = *w;
    uVar14 = *h;
    uVar11 = 0x5c;
    if (CONCAT44(0,uVar14) * (ulong)uVar15 >> 0x3d == 0) {
      info = &(state->info_png).color;
      info_00 = &state->info_raw;
      local_268 = out;
      local_260 = h;
      uVar12 = lodepng_get_bpp(info);
      uVar13 = lodepng_get_bpp(info_00);
      if (uVar13 < uVar12) {
        uVar13 = uVar12;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (ulong)(uVar15 >> 3) * (ulong)uVar13 +
                     ((ulong)(uVar15 & 7) * (ulong)uVar13 + 7 >> 3) + 5;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = CONCAT44(0,uVar14);
      if (SUB168(auVar4 * auVar5,8) == 0) {
        puVar17 = (uchar *)malloc(insize);
        if (puVar17 != (uchar *)0x0) {
          info_01 = &state->info_png;
          puVar19 = in + 0x21;
          local_250 = (state->info_png).unknown_chunks_data;
          local_258 = (state->info_png).unknown_chunks_size;
          iVar16 = 1;
          uVar23 = 0;
          bVar28 = false;
LAB_0011901e:
          uVar26 = ((long)puVar19 - (long)in) + 0xc;
          data = puVar19 + 8;
LAB_00119045:
          puVar9 = local_260;
          if (!bVar28) {
            if (insize < uVar26 || puVar19 < in) {
              if ((state->decoder).ignore_end != 0) goto LAB_001194c4;
              uVar11 = 0x1e;
              goto LAB_0011984c;
            }
            uVar11 = lodepng_read32bitInt(puVar19);
            if ((int)uVar11 < 0) {
              if ((state->decoder).ignore_end != 0) goto LAB_001194c4;
              uVar11 = 0x3f;
              goto LAB_0011984c;
            }
            uVar25 = (ulong)uVar11;
            uVar18 = uVar26 + uVar25;
            if ((insize < uVar18) || (uVar18 < (ulong)((long)puVar19 - (long)in))) {
              uVar11 = 0x40;
              goto LAB_0011984c;
            }
            uVar10 = lodepng_chunk_type_equals(puVar19,"IDAT");
            if (uVar10 != '\0') {
              if ((!CARRY8(uVar23,uVar25)) && (uVar23 + uVar25 <= insize)) {
                lodepng_memcpy(puVar17 + uVar23,data,uVar25);
                iVar16 = 3;
                uVar23 = uVar23 + uVar25;
                goto LAB_001190e0;
              }
              uVar11 = 0x5f;
              goto LAB_0011984c;
            }
            uVar10 = lodepng_chunk_type_equals(puVar19,"IEND");
            if (uVar10 != '\0') {
              bVar28 = true;
              bVar7 = false;
LAB_00119101:
              if (((state->decoder).ignore_crc == 0) &&
                 (uVar11 = lodepng_chunk_check_crc(puVar19), uVar11 != 0)) {
                uVar11 = 0x39;
                goto LAB_0011984c;
              }
              if (bVar7) goto LAB_00119460;
              goto LAB_00119045;
            }
            uVar10 = lodepng_chunk_type_equals(puVar19,"PLTE");
            if (uVar10 != '\0') {
              uVar11 = readChunk_PLTE(info,data,uVar25);
              state->error = uVar11;
              if (uVar11 == 0) {
                iVar16 = 2;
                goto LAB_001190e0;
              }
              goto LAB_00119854;
            }
            uVar10 = lodepng_chunk_type_equals(puVar19,"tRNS");
            if (uVar10 == '\0') {
              uVar10 = lodepng_chunk_type_equals(puVar19,"bKGD");
              if (uVar10 != '\0') {
                uVar11 = readChunk_bKGD(info_01,data,uVar25);
                goto LAB_001191be;
              }
              uVar10 = lodepng_chunk_type_equals(puVar19,"tEXt");
              if (uVar10 != '\0') {
                if ((state->decoder).read_text_chunks == 0) goto LAB_001190e0;
                uVar11 = readChunk_tEXt(info_01,data,uVar25);
LAB_00119288:
                state->error = uVar11;
                goto joined_r0x00119295;
              }
              uVar10 = lodepng_chunk_type_equals(puVar19,"zTXt");
              if (uVar10 != '\0') {
                if ((state->decoder).read_text_chunks != 0) {
                  uVar11 = readChunk_zTXt(info_01,&state->decoder,data,uVar25);
                  goto LAB_00119288;
                }
                goto LAB_001190e0;
              }
              uVar10 = lodepng_chunk_type_equals(puVar19,"iTXt");
              if (uVar10 != '\0') {
                if ((state->decoder).read_text_chunks != 0) {
                  uVar11 = readChunk_iTXt(info_01,&state->decoder,data,uVar25);
                  goto LAB_00119288;
                }
                goto LAB_001190e0;
              }
              uVar10 = lodepng_chunk_type_equals(puVar19,"tIME");
              if (uVar10 == '\0') {
                uVar10 = lodepng_chunk_type_equals(puVar19,"pHYs");
                if (uVar10 == '\0') {
                  uVar10 = lodepng_chunk_type_equals(puVar19,"gAMA");
                  if (uVar10 != '\0') {
                    uVar11 = readChunk_gAMA(info_01,data,uVar25);
                    goto LAB_001191be;
                  }
                  uVar10 = lodepng_chunk_type_equals(puVar19,"cHRM");
                  if (uVar10 == '\0') {
                    uVar10 = lodepng_chunk_type_equals(puVar19,"sRGB");
                    if (uVar10 != '\0') {
                      if (uVar11 == 1) {
                        (state->info_png).srgb_defined = 1;
                        (state->info_png).srgb_intent = (uint)*data;
                        state->error = 0;
                        goto LAB_001190e0;
                      }
                      uVar11 = 0x62;
                      goto LAB_0011984c;
                    }
                    uVar10 = lodepng_chunk_type_equals(puVar19,"iCCP");
                    if (uVar10 != '\0') {
                      uVar11 = readChunk_iCCP(info_01,&state->decoder,data,uVar25);
                      state->error = uVar11;
                      goto joined_r0x00119295;
                    }
                    uVar10 = lodepng_chunk_type_equals(puVar19,"sBIT");
                    if (uVar10 != '\0') {
                      uVar11 = readChunk_sBIT(info_01,data,uVar25);
                      goto LAB_001191be;
                    }
                    if (((state->decoder).ignore_critical != 0) || ((puVar19[4] & 0x20) != 0)) {
                      if ((state->decoder).remember_unknown_chunks != 0) {
                        uVar11 = lodepng_chunk_append
                                           (local_250 + (iVar16 - 1U),local_258 + (iVar16 - 1U),
                                            puVar19);
                        state->error = uVar11;
                        if (uVar11 != 0) goto LAB_00119854;
                      }
                      bVar28 = false;
                      goto LAB_00119460;
                    }
                    uVar11 = 0x45;
                    goto LAB_0011984c;
                  }
                  uVar11 = readChunk_cHRM(info_01,data,uVar25);
                }
                else {
                  uVar11 = readChunk_pHYs(info_01,data,uVar25);
                }
              }
              else {
                uVar11 = readChunk_tIME(info_01,data,uVar25);
              }
            }
            else {
              uVar11 = readChunk_tRNS(info,data,uVar25);
            }
LAB_001191be:
            state->error = uVar11;
joined_r0x00119295:
            if (uVar11 != 0) goto LAB_00119854;
LAB_001190e0:
            bVar28 = false;
            bVar7 = true;
            goto LAB_00119101;
          }
LAB_001194c4:
          if ((info->colortype == LCT_PALETTE) && ((state->info_png).color.palette == (uchar *)0x0))
          {
            uVar11 = 0x6a;
LAB_0011984c:
            state->error = uVar11;
LAB_00119854:
            free(puVar17);
            goto LAB_00119b10;
          }
          uVar11 = (state->info_png).interlace_method;
          uVar14 = lodepng_get_bpp(info);
          uVar15 = *w;
          uVar26 = (ulong)uVar14;
          if (uVar11 == 0) {
            sVar22 = (uVar26 * (uVar15 >> 3) + (ulong)((uVar15 & 7) * uVar14 + 7 >> 3) + 1) *
                     (ulong)*puVar9;
          }
          else {
            uVar13 = *puVar9;
            lVar24 = (uVar15 + 7 >> 6) * uVar26 + (ulong)((uVar15 + 7 >> 3 & 7) * uVar14 + 7 >> 3) +
                     1;
            uVar11 = uVar15 + 3;
            if (4 < uVar15) {
              lVar24 = lVar24 + (ulong)((uVar11 >> 3 & 7) * uVar14 + 7 >> 3) +
                                (uVar11 >> 6) * uVar26 + 1;
            }
            lVar24 = (ulong)(uVar13 + 3 >> 3) *
                     ((uVar11 >> 5) * uVar26 + (ulong)((uVar11 >> 2 & 7) * uVar14 + 7 >> 3) + 1) +
                     lVar24 * (ulong)(uVar13 + 7 >> 3);
            uVar11 = uVar15 + 1;
            if (2 < uVar15) {
              lVar24 = lVar24 + (ulong)(uVar13 + 3 >> 2) *
                                ((ulong)((uVar11 >> 2 & 7) * uVar14 + 7 >> 3) +
                                 (uVar11 >> 5) * uVar26 + 1);
            }
            lVar24 = (ulong)(uVar13 + 1 >> 2) *
                     ((uVar11 >> 4) * uVar26 + (ulong)((uVar11 >> 1 & 7) * uVar14 + 7 >> 3) + 1) +
                     lVar24;
            if (1 < uVar15) {
              lVar24 = lVar24 + (ulong)(uVar13 + 1 >> 1) *
                                ((ulong)((uVar15 >> 1 & 7) * uVar14 + 7 >> 3) +
                                 (uVar15 >> 4) * uVar26 + 1);
            }
            sVar22 = ((uVar15 >> 3) * uVar26 + (ulong)((uVar15 & 7) * uVar14 + 7 >> 3) + 1) *
                     (ulong)(uVar13 >> 1) + lVar24;
          }
          uVar15 = zlib_decompress(&scanlines,&scanlines_size,sVar22,puVar17,uVar23,
                                   (LodePNGDecompressSettings *)state);
          bVar28 = scanlines_size != sVar22;
          uVar11 = 0x5b;
          if (!bVar28) {
            uVar11 = uVar15;
          }
          if (uVar15 != 0) {
            uVar11 = uVar15;
          }
          state->error = uVar11;
          free(puVar17);
          if (bVar28 || uVar15 != 0) goto LAB_00119b10;
          uVar11 = *w;
          uVar15 = *puVar9;
          sVar22 = lodepng_get_raw_size(uVar11,uVar15,info);
          puVar19 = (uchar *)malloc(sVar22);
          puVar17 = scanlines;
          *local_268 = puVar19;
          if (puVar19 == (uchar *)0x0) {
            uVar14 = 0x53;
            goto LAB_00119b08;
          }
          for (sVar20 = 0; sVar22 != sVar20; sVar20 = sVar20 + 1) {
            puVar19[sVar20] = '\0';
          }
          uVar13 = lodepng_get_bpp(info);
          if (uVar13 == 0) {
            uVar14 = 0x1f;
          }
          else if ((state->info_png).interlace_method == 0) {
            if (uVar13 < 8) {
              uVar12 = uVar13 * uVar11;
              uVar27 = uVar12 + 7 & 0xfffffff8;
              if (uVar12 != uVar27) {
                uVar14 = unfilter(puVar17,puVar17,uVar11,uVar15,uVar13);
                if (uVar14 == 0) {
                  removePaddingBits(puVar19,puVar17,(ulong)uVar12,(ulong)uVar27,uVar15);
                  goto LAB_00119b06;
                }
                goto LAB_00119b08;
              }
            }
            uVar14 = unfilter(puVar19,puVar17,uVar11,uVar15,uVar13);
            if (uVar14 == 0) goto LAB_00119b06;
          }
          else {
            Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar11,
                                uVar15,uVar13);
            for (lVar24 = 0; lVar24 != 0x1c; lVar24 = lVar24 + 4) {
              lVar3 = *(long *)((long)padded_passstart + lVar24 * 2);
              uVar12 = *(uint *)((long)passw + lVar24);
              uVar27 = *(uint *)((long)passh + lVar24);
              uVar14 = unfilter(puVar17 + lVar3,
                                puVar17 + *(long *)((long)filter_passstart + lVar24 * 2),uVar12,
                                uVar27,uVar13);
              if (uVar14 != 0) goto LAB_00119b08;
              if (uVar13 < 8) {
                uVar12 = uVar12 * uVar13;
                removePaddingBits(puVar17 + *(long *)((long)local_178 + lVar24 * 2),puVar17 + lVar3,
                                  (ulong)uVar12,(ulong)(uVar12 + 7 & 0xfffffff8),uVar27);
              }
            }
            Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,passstart,
                                uVar11,uVar15,uVar13);
            if (uVar13 < 8) {
              for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
                uVar15 = passw_1[lVar24];
                uVar14 = passh_1[lVar24];
                for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
                  for (uVar26 = 0; uVar26 != uVar15; uVar26 = uVar26 + 1) {
                    uVar18 = (ulong)(((int)uVar23 * uVar15 + (int)uVar26) * uVar13) +
                             passstart[lVar24] * 8;
                    local_240 = (ADAM7_DX[lVar24] * uVar26 + (ulong)ADAM7_IX[lVar24]) *
                                (ulong)uVar13 +
                                (ADAM7_DY[lVar24] * uVar23 + (ulong)ADAM7_IY[lVar24]) *
                                (ulong)(uVar11 * uVar13);
                    uVar25 = (ulong)uVar13;
                    while (iVar16 = (int)uVar25, uVar25 = (ulong)(iVar16 - 1), iVar16 != 0) {
                      uVar21 = uVar18 >> 3;
                      bVar6 = (byte)uVar18;
                      uVar18 = uVar18 + 1;
                      setBitOfReversedStream
                                (&local_240,puVar19,(puVar17[uVar21] >> (~bVar6 & 7) & 1) != 0);
                    }
                  }
                }
              }
            }
            else {
              uVar23 = (ulong)(uVar13 >> 3);
              for (lVar24 = 0; lVar24 != 7; lVar24 = lVar24 + 1) {
                uVar15 = passh_1[lVar24];
                for (uVar26 = 0; uVar26 != uVar15; uVar26 = uVar26 + 1) {
                  uVar14 = passw_1[lVar24];
                  uVar13 = uVar14 * (int)uVar26;
                  for (uVar18 = 0; uVar18 != uVar14; uVar18 = uVar18 + 1) {
                    uVar12 = ADAM7_IY[lVar24];
                    uVar27 = ADAM7_IX[lVar24];
                    uVar1 = ADAM7_DX[lVar24];
                    uVar2 = ADAM7_DY[lVar24];
                    sVar22 = passstart[lVar24];
                    for (uVar25 = 0; uVar23 != uVar25; uVar25 = uVar25 + 1) {
                      puVar19[uVar25 + ((uVar2 * uVar26 + (ulong)uVar12) * (ulong)uVar11 +
                                       uVar1 * uVar18 + (ulong)uVar27) * uVar23] =
                           puVar17[uVar25 + uVar13 * uVar23 + sVar22];
                    }
                    uVar13 = uVar13 + 1;
                  }
                }
              }
            }
LAB_00119b06:
            uVar14 = 0;
          }
LAB_00119b08:
          state->error = uVar14;
LAB_00119b10:
          free(scanlines);
          if (state->error != 0) {
            return state->error;
          }
          if ((state->decoder).color_convert == 0) {
            uVar11 = lodepng_color_mode_copy(info_00,info);
            state->error = uVar11;
            return uVar11;
          }
          iVar16 = lodepng_color_mode_equal(info_00,info);
          ppuVar8 = local_268;
          if (iVar16 != 0) {
            return 0;
          }
          puVar17 = *local_268;
          if (((info_00->colortype | LCT_GREY_ALPHA) != LCT_RGBA) &&
             ((state->info_raw).bitdepth != 8)) {
            return 0x38;
          }
          uVar11 = *w;
          uVar15 = *local_260;
          sVar22 = lodepng_get_raw_size(uVar11,uVar15,info_00);
          puVar19 = (uchar *)malloc(sVar22);
          *ppuVar8 = puVar19;
          if (puVar19 == (uchar *)0x0) {
            uVar11 = 0x53;
          }
          else {
            uVar11 = lodepng_convert(puVar19,puVar17,info_00,info,uVar11,uVar15);
          }
          state->error = uVar11;
          free(puVar17);
          return state->error;
        }
        uVar11 = 0x53;
      }
    }
    state->error = uVar11;
  }
  return uVar11;
LAB_00119460:
  puVar19 = lodepng_chunk_next_const(puVar19,in + insize);
  goto LAB_0011901e;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize) {
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  } else { /*color conversion needed*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from grayscale input color type, to 8-bit grayscale or grayscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out)) {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}